

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.cpp
# Opt level: O2

QString * guidToUString(QString *__return_storage_ptr__,EFI_GUID *guid,bool convertToString)

{
  undefined7 in_register_00000011;
  QString *readableName;
  
  if ((int)CONCAT71(in_register_00000011,convertToString) != 0) {
    guidDatabaseLookup(__return_storage_ptr__,guid);
    if ((__return_storage_ptr__->d).size != 0) {
      return __return_storage_ptr__;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&__return_storage_ptr__->d);
  }
  usprintf(__return_storage_ptr__,"%08X-%04X-%04X-%02X%02X-%02X%02X%02X%02X%02X%02X",
           (ulong)guid->Data1,(ulong)guid->Data2,(ulong)guid->Data3,(ulong)guid->Data4[0],
           (ulong)guid->Data4[1],(ulong)guid->Data4[2],(ulong)guid->Data4[3],(ulong)guid->Data4[4],
           (ulong)guid->Data4[5],(ulong)guid->Data4[6],(ulong)guid->Data4[7]);
  return __return_storage_ptr__;
}

Assistant:

UString guidToUString(const EFI_GUID & guid, bool convertToString)
{
    if (convertToString) {
        UString readableName = guidDatabaseLookup(guid);
        if (!readableName.isEmpty())
            return readableName;
    }
    
    return usprintf("%08X-%04X-%04X-%02X%02X-%02X%02X%02X%02X%02X%02X",
                    guid.Data1,
                    guid.Data2,
                    guid.Data3,
                    guid.Data4[0],
                    guid.Data4[1],
                    guid.Data4[2],
                    guid.Data4[3],
                    guid.Data4[4],
                    guid.Data4[5],
                    guid.Data4[6],
                    guid.Data4[7]);
}